

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

void __thiscall ast::Inst_mrs::~Inst_mrs(Inst_mrs *this)

{
  Inst_mrs *this_local;
  
  ~Inst_mrs(this);
  operator_delete(this);
  return;
}

Assistant:

Inst_mrs(Register *rd, Register *rs, Location left) :
		Instruction {left}, rd {rd}, rs {rs} { }